

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callgrind_converter.cpp
# Opt level: O0

void __thiscall HawkTracer::client::CallgrindConverter::stop(CallgrindConverter *this)

{
  pointer *this_00;
  bool bVar1;
  byte bVar2;
  reference ppVar3;
  ostream *poVar4;
  shared_ptr<HawkTracer::client::CallGraph::TreeNode> local_310;
  reference local_300;
  pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> *root;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
  *__range4;
  ofstream thread_output_file;
  __cxx11 local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [8];
  string thread_file_name;
  undefined1 local_70 [8];
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
  root_calls;
  CallGraph _call_graph;
  pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>
  *thread;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>_>_>
  *__range2;
  CallgrindConverter *this_local;
  
  __end2 = std::
           unordered_map<unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>_>_>
           ::begin(&this->_events);
  thread = (pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>
            *)std::
              unordered_map<unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>_>_>
              ::end(&this->_events);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>,_false>
                            ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>,_false>
                              *)&thread), bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>,_false,_false>
             ::operator*(&__end2);
    this_00 = &root_calls.
               super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    CallGraph::CallGraph((CallGraph *)this_00);
    CallGraph::make((vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                     *)local_70,(CallGraph *)this_00,&ppVar3->second);
    std::operator+(local_c0,(char *)&this->_file_name);
    std::__cxx11::to_string(local_e0,ppVar3->first);
    std::operator+(local_a0,local_c0);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)local_c0);
    std::ofstream::ofstream(&__range4,local_a0,0x10);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Can\'t open file: ");
      poVar4 = std::operator<<(poVar4,(string *)local_a0);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = std::operator<<((ostream *)&__range4,(string *)&this->_callgrind_header);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&__range4,"thread: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar3->first);
      std::operator<<(poVar4,"\n\n");
      poVar4 = std::operator<<((ostream *)&__range4,"events: Duration");
      std::operator<<(poVar4,"\n");
      __end4 = std::
               vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
               ::begin((vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                        *)local_70);
      root = (pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int> *)
             std::
             vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
             ::end((vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                    *)local_70);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
                                         *)&root), bVar1) {
        local_300 = __gnu_cxx::
                    __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
                    ::operator*(&__end4);
        std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>::shared_ptr
                  (&local_310,&local_300->first);
        _print_function(this,(ofstream *)&__range4,&local_310);
        std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>::~shared_ptr(&local_310);
        __gnu_cxx::
        __normal_iterator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_*,_std::vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>_>
        ::operator++(&__end4);
      }
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&__range4);
    std::__cxx11::string::~string((string *)local_a0);
    std::
    vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
    ::~vector((vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
               *)local_70);
    CallGraph::~CallGraph
              ((CallGraph *)
               &root_calls.
                super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_int,_std::vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>_>,_false,_false>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void CallgrindConverter::stop()
{
    for (auto& thread : _events)
    {
        CallGraph _call_graph;
        auto root_calls = _call_graph.make(thread.second);

        std::string thread_file_name = _file_name + "." + std::to_string(thread.first);
        std::ofstream thread_output_file(thread_file_name);
        if (thread_output_file.is_open())
        {
            thread_output_file << _callgrind_header << std::endl;
            thread_output_file << "thread: " << thread.first << "\n\n";
            thread_output_file << "events: Duration" << "\n";
            for (auto& root : root_calls)
            {
                _print_function(thread_output_file, root.first);
            }
        }
        else
        {
            std::cerr << "Can't open file: " << thread_file_name << std::endl;
        }
        thread_output_file.close();
    }
}